

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int has_non_ASCII(char *_p)

{
  bool bVar1;
  uchar *p;
  char *_p_local;
  uint local_4;
  
  p = (uchar *)_p;
  if (_p == (char *)0x0) {
    local_4 = 1;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (*p != '\0') {
        bVar1 = *p < 0x80;
      }
      if (!bVar1) break;
      p = p + 1;
    }
    local_4 = (uint)(*p != '\0');
  }
  return local_4;
}

Assistant:

static int
has_non_ASCII(const char *_p)
{
	const unsigned char *p = (const unsigned char *)_p;

	if (p == NULL)
		return (1);
	while (*p != '\0' && *p < 128)
		p++;
	return (*p != '\0');
}